

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O2

optional<bssl::der::BitString> * __thiscall
bssl::der::ParseBitString(optional<bssl::der::BitString> *__return_storage_ptr__,der *this,Input in)

{
  Input bytes_00;
  bool bVar1;
  uint8_t uVar2;
  Input in_00;
  uint8_t unused_bits;
  Input bytes;
  ByteReader reader;
  byte local_39;
  Input local_38;
  ByteReader local_20;
  
  in_00.data_.size_ = in.data_.data_;
  in_00.data_.data_ = (uchar *)this;
  ByteReader::ByteReader(&local_20,in_00);
  bVar1 = ByteReader::ReadByte(&local_20,&local_39);
  if ((!bVar1) || (7 < local_39)) {
    (__return_storage_ptr__->super__Optional_base<bssl::der::BitString,_true,_true>)._M_payload.
    super__Optional_payload_base<bssl::der::BitString>._M_engaged = false;
    return __return_storage_ptr__;
  }
  local_38.data_.data_ = (uchar *)0x0;
  local_38.data_.size_ = 0;
  bVar1 = ByteReader::ReadBytes(&local_20,local_20.data_.size_,&local_38);
  if (bVar1) {
    if (local_39 == 0) {
      local_39 = 0;
    }
    else if ((local_38.data_.size_ == 0) ||
            (uVar2 = Input::back(&local_38), (uint8_t)(uVar2 << (8 - local_39 & 0x1f)) != '\0'))
    goto LAB_0037f6f8;
    bytes_00.data_.size_ = local_38.data_.size_;
    bytes_00.data_.data_ = local_38.data_.data_;
    BitString::BitString((BitString *)__return_storage_ptr__,bytes_00,local_39);
    bVar1 = true;
  }
  else {
LAB_0037f6f8:
    bVar1 = false;
  }
  (__return_storage_ptr__->super__Optional_base<bssl::der::BitString,_true,_true>)._M_payload.
  super__Optional_payload_base<bssl::der::BitString>._M_engaged = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::optional<BitString> ParseBitString(Input in) {
  ByteReader reader(in);

  // From ITU-T X.690, section 8.6.2.2 (applies to BER, CER, DER):
  //
  // The initial octet shall encode, as an unsigned binary integer with
  // bit 1 as the least significant bit, the number of unused bits in the final
  // subsequent octet. The number shall be in the range zero to seven.
  uint8_t unused_bits;
  if (!reader.ReadByte(&unused_bits)) {
    return std::nullopt;
  }
  if (unused_bits > 7) {
    return std::nullopt;
  }

  Input bytes;
  if (!reader.ReadBytes(reader.BytesLeft(), &bytes)) {
    return std::nullopt;  // Not reachable.
  }

  // Ensure that unused bits in the last byte are set to 0.
  if (unused_bits > 0) {
    // From ITU-T X.690, section 8.6.2.3 (applies to BER, CER, DER):
    //
    // If the bitstring is empty, there shall be no subsequent octets,
    // and the initial octet shall be zero.
    if (bytes.empty()) {
      return std::nullopt;
    }
    uint8_t last_byte = bytes.back();

    // From ITU-T X.690, section 11.2.1 (applies to CER and DER, but not BER):
    //
    // Each unused bit in the final octet of the encoding of a bit string value
    // shall be set to zero.
    uint8_t mask = 0xFF >> (8 - unused_bits);
    if ((mask & last_byte) != 0) {
      return std::nullopt;
    }
  }

  return BitString(bytes, unused_bits);
}